

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O0

void PIT_FloorRaise(AActor *thing,FChangePosition *cpos)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  TFlags<ActorFlag6,_unsigned_int> local_34;
  TFlags<ActorFlag,_unsigned_int> local_30;
  TFlags<ActorFlag4,_unsigned_int> local_2c;
  double local_28;
  double oldz;
  double oldfloorz;
  FChangePosition *cpos_local;
  AActor *thing_local;
  
  oldz = thing->floorz;
  oldfloorz = (double)cpos;
  cpos_local = (FChangePosition *)thing;
  local_28 = AActor::Z(thing);
  P_AdjustFloorCeil((AActor *)cpos_local,(FChangePosition *)oldfloorz);
  if ((oldz != (double)cpos_local[0xc].sector) || (NAN(oldz) || NAN((double)cpos_local[0xc].sector))
     ) {
    dVar4 = AActor::Z((AActor *)cpos_local);
    if ((double)cpos_local[0xc].sector < dVar4) {
      TFlags<ActorFlag,_unsigned_int>::operator&
                (&local_30,
                 (int)cpos_local + (MF_SPAWNCEILING|MF_JUSTATTACKED|MF_NOSECTOR|MF_SHOOTABLE));
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_30);
      bVar3 = false;
      if (uVar1 != 0) {
        TFlags<ActorFlag6,_unsigned_int>::operator&
                  (&local_34,(int)cpos_local + (MF6_NOTELEFRAG|MF6_STEPMISSILE|MF6_BUMPSPECIAL));
        uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_34);
        bVar3 = uVar1 != 0;
      }
      if (!bVar3) {
        return;
      }
      TArray<AActor_*,_AActor_*>::Clear(&intersectors);
      AActor::AddZ((AActor *)cpos_local,-oldz + (double)cpos_local[0xc].sector,true);
    }
    else {
      TFlags<ActorFlag4,_unsigned_int>::operator&
                (&local_2c,
                 (int)cpos_local + (MF4_STRIFEDAMAGE|MF4_ACTLIKEBRIDGE|MF4_RANDOMIZE|MF4_BOSSDEATH))
      ;
      uVar1 = TFlags::operator_cast_to_unsigned_int((TFlags *)&local_2c);
      if (uVar1 != 0) {
        *(undefined1 *)((long)oldfloorz + 0x14) = 1;
        return;
      }
      TArray<AActor_*,_AActor_*>::Clear(&intersectors);
      AActor::SetZ((AActor *)cpos_local,(double)cpos_local[0xc].sector,true);
    }
    iVar2 = P_PushUp((AActor *)cpos_local,(FChangePosition *)oldfloorz);
    if (iVar2 == 1) {
      P_DoCrunch((AActor *)cpos_local,(FChangePosition *)oldfloorz);
      P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
      AActor::UpdateRenderSectorList((AActor *)cpos_local);
    }
    else if (iVar2 == 2) {
      P_DoCrunch((AActor *)cpos_local,(FChangePosition *)oldfloorz);
      AActor::SetZ((AActor *)cpos_local,local_28,true);
    }
    else {
      P_CheckFakeFloorTriggers((AActor *)cpos_local,local_28,false);
      AActor::UpdateRenderSectorList((AActor *)cpos_local);
    }
    if ((cpos_local[0x15].moveamt != 0.0) &&
       (*(FChangePosition **)cpos_local[0x15].moveamt == cpos_local)) {
      dVar4 = AActor::Z((AActor *)cpos_local);
      *(double *)((long)cpos_local[0x15].moveamt + 0x60) =
           (dVar4 - local_28) + *(double *)((long)cpos_local[0x15].moveamt + 0x60);
    }
  }
  return;
}

Assistant:

void PIT_FloorRaise(AActor *thing, FChangePosition *cpos)
{
	double oldfloorz = thing->floorz;
	double oldz = thing->Z();

	P_AdjustFloorCeil(thing, cpos);

	if (oldfloorz == thing->floorz) return;

	// Move things intersecting the floor up
	if (thing->Z() <= thing->floorz)
	{
		if (thing->flags4 & MF4_ACTLIKEBRIDGE)
		{
			cpos->nofit = true;
			return; // do not move bridge things
		}
		intersectors.Clear();
		thing->SetZ(thing->floorz);
	}
	else
	{
		if ((thing->flags & MF_NOGRAVITY) && (thing->flags6 & MF6_RELATIVETOFLOOR))
		{
			intersectors.Clear();
			thing->AddZ(-oldfloorz + thing->floorz);
		}
		else return;
	}
	switch (P_PushUp(thing, cpos))
	{
	default:
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
		break;
	case 1:
		P_DoCrunch(thing, cpos);
		P_CheckFakeFloorTriggers(thing, oldz);
		thing->UpdateRenderSectorList();
		break;
	case 2:
		P_DoCrunch(thing, cpos);
		thing->SetZ(oldz);
		break;
	}
	if (thing->player && thing->player->mo == thing)
	{
		thing->player->viewz += thing->Z() - oldz;
	}
}